

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O3

void D4C(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
        int fft_size,D4COption *option,double **aperiodicity)

{
  ulong uVar1;
  int y_length;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  int i;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  double *y;
  void *pvVar6;
  void *__s;
  double *pdVar7;
  double *x_00;
  double *xi;
  ulong uVar8;
  double *pdVar9;
  double *input;
  double *input_00;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  fft_plan *pfVar23;
  uint fft_size_00;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined8 *puVar27;
  ulong uVar28;
  byte bVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double *extraout_XMM0_Qb;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  RandnState randn_state;
  ForwardRealFFT forward_real_fft;
  ForwardRealFFT forward_real_fft_1;
  undefined1 in_stack_fffffffffffffd80 [32];
  uint fft_size_01;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 uVar41;
  undefined4 uVar42;
  double *pdVar43;
  double dStack_160;
  RandnState local_138;
  ulong local_120;
  long local_118;
  double local_110;
  double local_108;
  double dStack_100;
  ForwardRealFFT local_f8;
  ForwardRealFFT local_98;
  
  bVar29 = 0;
  local_138.g_randn_x = 0;
  local_138.g_randn_y = 0;
  local_138.g_randn_z = 0;
  local_138.g_randn_w = 0;
  randn_reseed(&local_138);
  auVar34 = _DAT_0010d320;
  auVar36 = _DAT_0010d310;
  uVar28 = (ulong)(uint)f0_length;
  if (0 < f0_length) {
    uVar26 = (ulong)(fft_size / 2 + 1);
    lVar17 = uVar26 - 1;
    auVar33._8_4_ = (int)lVar17;
    auVar33._0_8_ = lVar17;
    auVar33._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar18 = 0;
    auVar33 = auVar33 ^ _DAT_0010d320;
    do {
      if (-2 < fft_size) {
        pdVar43 = aperiodicity[uVar18];
        uVar25 = 0;
        auVar39 = auVar36;
        do {
          auVar40 = auVar39 ^ auVar34;
          if ((bool)(~(auVar33._4_4_ < auVar40._4_4_ ||
                      auVar33._0_4_ < auVar40._0_4_ && auVar40._4_4_ == auVar33._4_4_) & 1)) {
            pdVar43[uVar25] = 0.999999999999;
          }
          if (auVar40._12_4_ <= auVar33._12_4_ &&
              (auVar40._8_4_ <= auVar33._8_4_ || auVar40._12_4_ != auVar33._12_4_)) {
            pdVar43[uVar25 + 1] = 0.999999999999;
          }
          uVar25 = uVar25 + 2;
          lVar17 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 2;
          auVar39._8_8_ = lVar17 + 2;
        } while ((uVar26 + 1 & 0x1fffffffe) != uVar25);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar28);
  }
  auVar36._0_8_ = (double)fs;
  dVar30 = log((auVar36._0_8_ * 4.0) / 47.0 + 1.0);
  dVar30 = exp2((double)(int)(dVar30 / 0.6931471805599453) + 1.0);
  uVar41 = SUB84(dVar30,0);
  uVar42 = (undefined4)((ulong)dVar30 >> 0x20);
  fft_size_00 = (uint)dVar30;
  local_f8.forward_fft.ip = (int *)0x0;
  local_f8.forward_fft.w = (double *)0x0;
  local_f8.forward_fft.out = (double *)0x0;
  local_f8.forward_fft.input = (double *)0x0;
  local_f8.forward_fft.in = (double *)0x0;
  local_f8.forward_fft.c_out = (fft_complex *)0x0;
  local_f8.forward_fft.flags = 0;
  local_f8.forward_fft._12_4_ = 0;
  local_f8.forward_fft.c_in = (fft_complex *)0x0;
  local_f8.spectrum = (fft_complex *)0x0;
  local_f8.forward_fft.n = 0;
  local_f8.forward_fft.sign = 0;
  local_f8.fft_size = 0;
  local_f8._4_4_ = 0;
  local_f8.waveform = (double *)0x0;
  pdVar43 = extraout_XMM0_Qb;
  InitializeForwardRealFFT(fft_size_00,&local_f8);
  local_108 = (double)(int)(double)CONCAT44(uVar42,uVar41);
  dStack_100 = (double)(int)(double)pdVar43;
  iVar2 = (int)((local_108 * 3000.0) / auVar36._0_8_);
  y_length = iVar2 * 2 + 1;
  uVar26 = (long)y_length * 8;
  if (iVar2 < 0) {
    uVar26 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar26);
  NuttallWindow(y_length,y);
  uVar26 = uVar28 * 8;
  if (f0_length < 0) {
    uVar26 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar26);
  dVar30 = log((auVar36._0_8_ * 3.0) / 40.0 + 1.0);
  dVar30 = exp2((double)(int)(dVar30 / 0.6931471805599453) + 1.0);
  uVar24 = (uint)dVar30;
  local_98.forward_fft.ip = (int *)0x0;
  local_98.forward_fft.w = (double *)0x0;
  local_98.forward_fft.out = (double *)0x0;
  local_98.forward_fft.input = (double *)0x0;
  local_98.forward_fft.in = (double *)0x0;
  local_98.forward_fft.c_out = (fft_complex *)0x0;
  local_98.forward_fft.flags = 0;
  local_98.forward_fft._12_4_ = 0;
  local_98.forward_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.forward_fft.n = 0;
  local_98.forward_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeForwardRealFFT(uVar24,&local_98);
  dVar31 = auVar36._0_8_ * 0.5 + -3000.0;
  dVar30 = 15000.0;
  if (dVar31 <= 15000.0) {
    dVar30 = dVar31;
  }
  uVar3 = (uint)(dVar30 / 3000.0);
  if (0 < f0_length) {
    dVar30 = (double)(int)uVar24;
    pdVar43 = (double *)0x0;
    auVar34._0_8_ = dVar30 * 4000.0;
    auVar34._8_8_ = dVar30 * 7900.0;
    auVar36._8_8_ = auVar36._0_8_;
    auVar34 = divpd(auVar34,auVar36);
    dVar31 = ceil(auVar34._0_8_);
    dStack_160 = auVar34._8_8_;
    dVar32 = ceil(dStack_160);
    iVar2 = (int)dVar32;
    dVar30 = ceil((dVar30 * 100.0) / auVar36._0_8_);
    uVar16 = (uint)dVar30;
    uVar26 = (ulong)uVar16;
    uVar18 = (ulong)uVar24 << 3;
    if ((int)uVar24 < 0) {
      uVar18 = 0xffffffffffffffff;
    }
    uVar41 = 0;
    lVar19 = (long)(int)uVar16;
    lVar17 = (long)(int)dVar31;
    iVar22 = iVar2 - uVar16;
    uVar25 = 0;
    do {
      dVar30 = f0[uVar25];
      dVar31 = 0.0;
      if ((dVar30 != 0.0) || (NAN(dVar30))) {
        if (dVar30 <= 40.0) {
          dVar30 = 40.0;
        }
        dVar31 = temporal_positions[uVar25];
        __s = operator_new__(uVar18);
        iVar4 = matlab_round((auVar36._0_8_ * 1.5) / dVar30);
        anon_unknown.dwarf_4a4b::GetWindowedWaveform
                  (x,x_length,fs,dVar30,dVar31,2,3.0,local_98.waveform,&local_138);
        if (iVar4 * 2 + 1 < (int)uVar24) {
          memset(local_98.waveform + (long)(iVar4 * 2) + 1,0,
                 (ulong)((uVar24 - 2) + iVar4 * -2) * 8 + 8);
        }
        pfVar23 = &local_98.forward_fft;
        puVar27 = (undefined8 *)&stack0xfffffffffffffd58;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar27 = *(undefined8 *)pfVar23;
          pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
          puVar27 = puVar27 + (ulong)bVar29 * -2 + 1;
        }
        p.c_out._0_4_ = fs;
        p.n = in_stack_fffffffffffffd80._0_4_;
        p.sign = in_stack_fffffffffffffd80._4_4_;
        p.flags = in_stack_fffffffffffffd80._8_4_;
        p._12_4_ = in_stack_fffffffffffffd80._12_4_;
        p.c_in = (fft_complex *)in_stack_fffffffffffffd80._16_8_;
        p.in = (double *)in_stack_fffffffffffffd80._24_8_;
        p.c_out._4_4_ = fft_size_00;
        p.out = (double *)lVar17;
        p.input._0_4_ = in_stack_fffffffffffffdb0;
        p.input._4_4_ = x_length;
        p.ip._0_4_ = uVar16;
        p.ip._4_4_ = uVar41;
        p.w = pdVar43;
        fft_execute(p);
        if (-1 < (int)uVar16) {
          memset(__s,0,uVar26 * 8 + 8);
        }
        if ((int)uVar16 < (int)uVar24 / 2) {
          pdVar7 = local_98.spectrum[lVar19 + 1] + 1;
          lVar20 = lVar19;
          do {
            *(double *)((long)__s + lVar20 * 8 + 8) =
                 (*(fft_complex *)(pdVar7 + -1))[0] * (*(fft_complex *)(pdVar7 + -1))[0] +
                 *pdVar7 * *pdVar7;
            lVar20 = lVar20 + 1;
            pdVar7 = pdVar7 + 2;
          } while ((int)uVar24 / 2 != lVar20);
        }
        if ((int)uVar16 <= iVar2) {
          dVar30 = *(double *)((long)__s + lVar19 * 8 + -8);
          lVar20 = 0;
          do {
            dVar30 = dVar30 + *(double *)((long)__s + lVar20 * 8 + lVar19 * 8);
            *(double *)((long)__s + lVar20 * 8 + lVar19 * 8) = dVar30;
            lVar20 = lVar20 + 1;
          } while (iVar22 + 1 != (int)lVar20);
        }
        dVar31 = *(double *)((long)__s + lVar17 * 8) / *(double *)((long)__s + (long)iVar2 * 8);
        operator_delete__(__s);
      }
      *(double *)((long)pvVar6 + uVar25 * 8) = dVar31;
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar28);
  }
  DestroyForwardRealFFT(&local_98);
  uVar26 = (long)(int)uVar3 * 8 + 0x10;
  if ((int)uVar3 < -2) {
    uVar26 = 0xffffffffffffffff;
  }
  pdVar7 = (double *)operator_new__(uVar26);
  *pdVar7 = -60.0;
  uVar24 = uVar3 + 1;
  pdVar7[(int)uVar24] = -1e-12;
  x_00 = (double *)operator_new__(uVar26);
  auVar34 = _DAT_0010d320;
  if (-1 < (int)uVar3) {
    lVar17 = (ulong)uVar24 - 1;
    auVar35._8_4_ = (int)lVar17;
    auVar35._0_8_ = lVar17;
    auVar35._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar26 = 0;
    auVar35 = auVar35 ^ _DAT_0010d320;
    auVar40 = _DAT_0010d310;
    do {
      auVar33 = auVar40 ^ auVar34;
      if ((bool)(~(auVar33._4_4_ == auVar35._4_4_ && auVar35._0_4_ < auVar33._0_4_ ||
                  auVar35._4_4_ < auVar33._4_4_) & 1)) {
        x_00[uVar26] = (double)(int)uVar26 * 3000.0;
      }
      if ((auVar33._12_4_ != auVar35._12_4_ || auVar33._8_4_ <= auVar35._8_4_) &&
          auVar33._12_4_ <= auVar35._12_4_) {
        x_00[uVar26 + 1] = (double)((int)uVar26 + 1) * 3000.0;
      }
      uVar26 = uVar26 + 2;
      lVar17 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar17 + 2;
    } while (((ulong)uVar24 + 1 & 0x1fffffffe) != uVar26);
  }
  x_00[(int)uVar24] = auVar36._0_8_ * 0.5;
  uVar24 = fft_size / 2 + 1;
  uVar26 = 0xffffffffffffffff;
  if (-4 < fft_size) {
    uVar26 = (long)(fft_size / 2) * 8 + 8;
  }
  xi = (double *)operator_new__(uVar26);
  auVar34 = _DAT_0010d320;
  uVar26 = (ulong)uVar24;
  if (-2 < fft_size) {
    lVar17 = uVar26 - 1;
    auVar37._8_4_ = (int)lVar17;
    auVar37._0_8_ = lVar17;
    auVar37._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar18 = 0;
    auVar37 = auVar37 ^ _DAT_0010d320;
    auVar38 = _DAT_0010d310;
    do {
      auVar33 = auVar38 ^ auVar34;
      if ((bool)(~(auVar33._4_4_ == auVar37._4_4_ && auVar37._0_4_ < auVar33._0_4_ ||
                  auVar37._4_4_ < auVar33._4_4_) & 1)) {
        xi[uVar18] = ((double)(int)uVar18 * auVar36._0_8_) / (double)fft_size;
      }
      if ((auVar33._12_4_ != auVar37._12_4_ || auVar33._8_4_ <= auVar37._8_4_) &&
          auVar33._12_4_ <= auVar37._12_4_) {
        xi[uVar18 + 1] = ((double)((int)uVar18 + 1) * auVar36._0_8_) / (double)fft_size;
      }
      uVar18 = uVar18 + 2;
      lVar17 = auVar38._8_8_;
      auVar38._0_8_ = auVar38._0_8_ + 2;
      auVar38._8_8_ = lVar17 + 2;
    } while ((uVar26 + 1 & 0x1fffffffe) != uVar18);
  }
  if (0 < f0_length) {
    uVar25 = (ulong)((int)fft_size_00 / 2 + 1);
    local_118 = (long)((int)fft_size_00 / 2);
    local_120 = local_118 * 8 + 8;
    uVar18 = 0xffffffffffffffff;
    if (-4 < (int)fft_size_00) {
      uVar18 = local_120;
    }
    uVar8 = (ulong)fft_size_00;
    local_110 = (local_108 * 8.0) / (double)y_length;
    uVar15 = 0;
    uVar16 = y_length - (y_length >> 0x1f) & 0xfffffffe;
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    do {
      dVar30 = f0[uVar15];
      if (((dVar30 != 0.0) || (NAN(dVar30))) &&
         (option->threshold < *(double *)((long)pvVar6 + uVar15 * 8))) {
        dVar31 = 47.0;
        if (47.0 <= dVar30) {
          dVar31 = dVar30;
        }
        uVar41 = SUB84(temporal_positions[uVar15],0);
        uVar42 = (undefined4)((ulong)temporal_positions[uVar15] >> 0x20);
        pdVar9 = (double *)operator_new__(uVar18);
        input = (double *)operator_new__(uVar18);
        input_00 = (double *)operator_new__(uVar18);
        pdVar10 = (double *)operator_new__(uVar18);
        pdVar11 = (double *)operator_new__(uVar18);
        dVar30 = 0.25 / dVar31;
        iVar2 = fs;
        anon_unknown.dwarf_4a4b::GetCentroid
                  (x,x_length,fs,dVar31,fft_size_00,(double)CONCAT44(uVar42,uVar41) - dVar30,
                   &local_f8,pdVar10,&local_138);
        uVar5 = fft_size_00;
        anon_unknown.dwarf_4a4b::GetCentroid
                  (x,x_length,fs,dVar31,fft_size_00,dVar30 + (double)CONCAT44(uVar42,uVar41),
                   &local_f8,pdVar11,&local_138);
        if (-2 < (int)fft_size_00) {
          uVar12 = 0;
          do {
            pdVar9[uVar12] = pdVar10[uVar12] + pdVar11[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar25 != uVar12);
        }
        DCCorrection(pdVar9,dVar31,iVar2,fft_size_00,pdVar9);
        operator_delete__(pdVar10);
        operator_delete__(pdVar11);
        pdVar10 = local_f8.waveform;
        if (0 < (int)fft_size_00) {
          memset(local_f8.waveform,0,uVar8 << 3);
        }
        fs = iVar2;
        anon_unknown.dwarf_4a4b::GetWindowedWaveform
                  (x,x_length,iVar2,dVar31,(double)CONCAT44(uVar42,uVar41),1,4.0,pdVar10,&local_138)
        ;
        pfVar23 = &local_f8.forward_fft;
        puVar27 = (undefined8 *)&stack0xfffffffffffffd58;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          *puVar27 = *(undefined8 *)pfVar23;
          pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
          puVar27 = puVar27 + (ulong)bVar29 * -2 + 1;
        }
        p_00.c_out._0_4_ = fs;
        p_00.n = in_stack_fffffffffffffd80._0_4_;
        p_00.sign = in_stack_fffffffffffffd80._4_4_;
        p_00.flags = in_stack_fffffffffffffd80._8_4_;
        p_00._12_4_ = in_stack_fffffffffffffd80._12_4_;
        p_00.c_in = (fft_complex *)in_stack_fffffffffffffd80._16_8_;
        p_00.in = (double *)in_stack_fffffffffffffd80._24_8_;
        p_00.c_out._4_4_ = uVar5;
        p_00.out = (double *)dVar31;
        p_00.input._0_4_ = in_stack_fffffffffffffdb0;
        p_00.input._4_4_ = x_length;
        p_00.ip._0_4_ = uVar41;
        p_00.ip._4_4_ = uVar42;
        p_00.w = pdVar43;
        fft_execute(p_00);
        if ((int)uVar5 < -1) {
          DCCorrection(input,dVar31,iVar2,uVar5,input);
          LinearSmoothing(input,dVar31,iVar2,uVar5,input);
          fft_size_01 = uVar5;
        }
        else {
          pdVar10 = *local_f8.spectrum + 1;
          uVar12 = 0;
          do {
            input[uVar12] =
                 (*(fft_complex *)(pdVar10 + -1))[0] * (*(fft_complex *)(pdVar10 + -1))[0] +
                 *pdVar10 * *pdVar10;
            uVar12 = uVar12 + 1;
            pdVar10 = pdVar10 + 2;
          } while (uVar25 != uVar12);
          fft_size_01 = uVar5;
          DCCorrection(input,dVar31,fs,uVar5,input);
          LinearSmoothing(input,dVar31,fs,uVar5,input);
          uVar12 = 0;
          do {
            input_00[uVar12] = pdVar9[uVar12] / input[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar25 != uVar12);
        }
        fft_size_00 = fft_size_01;
        LinearSmoothing(input_00,dVar31 * 0.5,fs,fft_size_01,input_00);
        pdVar10 = (double *)operator_new__(uVar18);
        LinearSmoothing(input_00,dVar31,fs,fft_size_01,pdVar10);
        if (-2 < (int)fft_size_01) {
          uVar12 = 0;
          do {
            input_00[uVar12] = input_00[uVar12] - pdVar10[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar25 != uVar12);
        }
        operator_delete__(pdVar10);
        uVar5 = matlab_round(local_110);
        if (0 < (int)fft_size_00) {
          memset(local_f8.waveform,0,uVar8 << 3);
        }
        pdVar10 = (double *)operator_new__(uVar18);
        if ((int)uVar3 < 1) {
          operator_delete__(pdVar10);
        }
        else {
          pdVar13 = pdVar10 + local_118;
          pdVar11 = pdVar10 + local_118 + 1;
          lVar17 = 0x3f;
          if ((long)local_120 >> 3 != 0) {
            for (; (ulong)((long)local_120 >> 3) >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          iVar2 = (int)local_118;
          uVar12 = 0;
          do {
            uVar1 = uVar12 + 1;
            if (-2 < y_length) {
              lVar19 = 0;
              do {
                local_f8.waveform[lVar19] =
                     input_00[((int)(((double)(int)uVar1 * 3000.0 * local_108) / auVar36._0_8_) -
                              y_length / 2) + lVar19] * y[lVar19];
                lVar19 = lVar19 + 1;
              } while ((ulong)uVar16 + 1 != lVar19);
            }
            lVar19 = 9;
            pfVar23 = &local_f8.forward_fft;
            puVar27 = (undefined8 *)&stack0xfffffffffffffd58;
            while( true ) {
              if (lVar19 == 0) break;
              lVar19 = lVar19 + -1;
              *puVar27 = *(undefined8 *)pfVar23;
              pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
              puVar27 = puVar27 + (ulong)bVar29 * -2 + 1;
            }
            p_01.c_out._0_4_ = fs;
            p_01.n = in_stack_fffffffffffffd80._0_4_;
            p_01.sign = in_stack_fffffffffffffd80._4_4_;
            p_01.flags = in_stack_fffffffffffffd80._8_4_;
            p_01._12_4_ = in_stack_fffffffffffffd80._12_4_;
            p_01.c_in = (fft_complex *)in_stack_fffffffffffffd80._16_8_;
            p_01.in = (double *)in_stack_fffffffffffffd80._24_8_;
            p_01.c_out._4_4_ = fft_size_00;
            p_01.out = (double *)dVar31;
            p_01.input._0_4_ = in_stack_fffffffffffffdb0;
            p_01.input._4_4_ = x_length;
            p_01.ip._0_4_ = (int)pdVar11;
            p_01.ip._4_4_ = (int)((ulong)pdVar11 >> 0x20);
            p_01.w = pdVar43;
            fft_execute(p_01);
            if (-2 < (int)fft_size_00) {
              pdVar14 = *local_f8.spectrum + 1;
              uVar21 = 0;
              do {
                pdVar10[uVar21] =
                     (*(fft_complex *)(pdVar14 + -1))[0] * (*(fft_complex *)(pdVar14 + -1))[0] +
                     *pdVar14 * *pdVar14;
                uVar21 = uVar21 + 1;
                pdVar14 = pdVar14 + 2;
              } while (uVar25 != uVar21);
            }
            if (pdVar10 != pdVar11) {
              std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar10,pdVar11,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
              std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar10,pdVar11);
            }
            if (1 < (int)fft_size_00) {
              dVar30 = *pdVar10;
              uVar21 = 1;
              do {
                dVar30 = dVar30 + pdVar10[uVar21];
                pdVar10[uVar21] = dVar30;
                uVar21 = uVar21 + 1;
              } while (uVar25 != uVar21);
            }
            dVar30 = log10(pdVar10[(int)(~uVar5 + iVar2)] / *pdVar13);
            pdVar7[uVar12 + 1] = dVar30 * 10.0;
            uVar12 = uVar1;
          } while (uVar1 != uVar3);
          operator_delete__(pdVar10);
          uVar12 = 0;
          do {
            dVar32 = pdVar7[uVar12 + 1] + (dVar31 + -100.0) / 50.0;
            dVar30 = 0.0;
            if (dVar32 <= 0.0) {
              dVar30 = dVar32;
            }
            pdVar7[uVar12 + 1] = dVar30;
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
        }
        operator_delete__(pdVar9);
        operator_delete__(input);
        operator_delete__(input_00);
        pdVar9 = aperiodicity[uVar15];
        interp1(x_00,pdVar7,uVar3 + 2,xi,uVar24,pdVar9);
        if (-2 < fft_size) {
          uVar12 = 0;
          do {
            dVar30 = pow(10.0,pdVar9[uVar12] / 20.0);
            pdVar9[uVar12] = dVar30;
            uVar12 = uVar12 + 1;
          } while (uVar26 != uVar12);
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar28);
  }
  DestroyForwardRealFFT(&local_f8);
  operator_delete__(pvVar6);
  operator_delete__(x_00);
  operator_delete__(pdVar7);
  operator_delete__(y);
  operator_delete__(xi);
  return;
}

Assistant:

void D4C(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    int fft_size, const D4COption *option, double **aperiodicity) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  InitializeAperiodicity(f0_length, fft_size, aperiodicity);

  int fft_size_d4c = static_cast<int>(pow(2.0, 1.0 +
    static_cast<int>(log(4.0 * fs / world::kFloorF0D4C + 1) /
      world::kLog2)));

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size_d4c, &forward_real_fft);

  int number_of_aperiodicities =
    static_cast<int>(MyMinDouble(world::kUpperLimit, fs / 2.0 -
      world::kFrequencyInterval) / world::kFrequencyInterval);
  // Since the window function is common in D4CGeneralBody(),
  // it is designed here to speed up.
  int window_length =
    static_cast<int>(world::kFrequencyInterval * fft_size_d4c / fs) * 2 + 1;
  double *window =  new double[window_length];
  NuttallWindow(window_length, window);

  // D4C Love Train (Aperiodicity of 0 Hz is given by the different algorithm)
  double *aperiodicity0 = new double[f0_length];
  D4CLoveTrain(x, fs, x_length, f0, f0_length, temporal_positions,
      aperiodicity0, &randn_state);

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;
  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  for (int i = 0; i < f0_length; ++i) {
    if (f0[i] == 0 || aperiodicity0[i] <= option->threshold) continue;
    D4CGeneralBody(x, x_length, fs, MyMaxDouble(world::kFloorF0D4C, f0[i]),
        fft_size_d4c, temporal_positions[i], number_of_aperiodicities, window,
        window_length, &forward_real_fft, &coarse_aperiodicity[1], &randn_state);

    // Linear interpolation to convert the coarse aperiodicity into its
    // spectral representation.
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] aperiodicity0;
  delete[] coarse_frequency_axis;
  delete[] coarse_aperiodicity;
  delete[] window;
  delete[] frequency_axis;
}